

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_4x64_impl.h
# Opt level: O3

uint32_t secp256k1_scalar_get_bits_var(secp256k1_scalar *a,uint offset,uint count)

{
  uint64_t *puVar1;
  undefined1 *puVar2;
  secp256k1_fe *r;
  secp256k1_fe *r_00;
  ulong uVar3;
  uint64_t uVar4;
  uint64_t uVar5;
  uint64_t uVar6;
  uint64_t uVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  uint32_t extraout_EAX;
  uint32_t extraout_EAX_00;
  uint32_t extraout_EAX_01;
  uint32_t extraout_EAX_02;
  uint32_t extraout_EAX_03;
  uint32_t uVar11;
  uint32_t extraout_EAX_04;
  uint32_t extraout_EAX_05;
  uint32_t extraout_EAX_06;
  ulong uVar12;
  byte bVar13;
  secp256k1_fe *in_RCX;
  secp256k1_fe *psVar14;
  int extraout_EDX;
  secp256k1_fe *extraout_RDX;
  secp256k1_fe *extraout_RDX_00;
  ulong uVar15;
  secp256k1_fe *a_00;
  uint uVar16;
  secp256k1_scalar *psVar17;
  undefined1 *puVar18;
  undefined4 in_register_00000034;
  secp256k1_ge *psVar19;
  secp256k1_ge *a_01;
  secp256k1_gej *a_02;
  secp256k1_scalar *r_01;
  secp256k1_scalar *psVar20;
  ulong uVar21;
  ulong uVar22;
  secp256k1_gej *r_02;
  secp256k1_gej *in_R8;
  long lVar23;
  bool bVar24;
  secp256k1_gej sStack_2e0;
  secp256k1_scalar *psStack_248;
  secp256k1_gej sStack_208;
  secp256k1_gej sStack_170;
  secp256k1_ge sStack_d8;
  secp256k1_scalar *psStack_70;
  
  psVar19 = (secp256k1_ge *)CONCAT44(in_register_00000034,offset);
  r_01 = a;
  secp256k1_scalar_verify(a);
  if (count - 0x21 < 0xffffffe0) {
    secp256k1_scalar_get_bits_var_cold_3();
  }
  else if (count + offset < 0x101) {
    uVar16 = (count + offset) - 1 >> 6;
    uVar10 = offset >> 6;
    if (uVar16 == uVar10) {
      secp256k1_scalar_verify(a);
      uVar10 = (uint)(a->d[uVar16] >> ((byte)offset & 0x3f));
LAB_0014d479:
      return (uVar10 << (-(char)count & 0x1fU)) >> (-(char)count & 0x1fU);
    }
    if (offset < 0xc0) {
      bVar13 = (byte)offset & 0x3f;
      uVar10 = (uint)(a->d[uVar10] >> bVar13) | (uint)(a->d[(ulong)uVar10 + 1] << 0x40 - bVar13);
      goto LAB_0014d479;
    }
    goto LAB_0014d496;
  }
  secp256k1_scalar_get_bits_var_cold_2();
LAB_0014d496:
  secp256k1_scalar_get_bits_var_cold_1();
  psVar14 = (secp256k1_fe *)((ulong)psVar19 & 0xffffffff);
  a_01 = psVar19;
  psVar20 = r_01;
  secp256k1_scalar_verify(r_01);
  if ((uint)psVar19 < 0x100) {
    uVar10 = extraout_EDX - 1U & 0x100 | (uint)psVar19;
    uVar16 = uVar10 >> 6;
    bVar13 = (byte)psVar14;
    uVar12 = (ulong)(uVar10 < 0x40) << (bVar13 & 0x3f);
    a_01 = (secp256k1_ge *)((ulong)(uVar16 == 1) << (bVar13 & 0x3f));
    uVar21 = (ulong)(uVar16 == 2) << (bVar13 & 0x3f);
    in_R8 = (secp256k1_gej *)((ulong)(uVar16 == 3) << (bVar13 & 0x3f));
    uVar3 = r_01->d[0];
    r_01->d[0] = r_01->d[0] + uVar12;
    puVar1 = r_01->d + 1;
    uVar12 = (ulong)CARRY8(uVar3,uVar12);
    uVar3 = *puVar1;
    uVar15 = (long)(a_01->x).n + *puVar1;
    *puVar1 = uVar15 + uVar12;
    puVar1 = r_01->d + 2;
    uVar12 = (ulong)(CARRY8(uVar3,(ulong)a_01) || CARRY8(uVar15,uVar12));
    uVar3 = *puVar1;
    uVar15 = *puVar1 + uVar21;
    *puVar1 = uVar15 + uVar12;
    puVar1 = r_01->d + 3;
    uVar3 = (ulong)(CARRY8(uVar3,uVar21) || CARRY8(uVar15,uVar12));
    bVar24 = CARRY8(*puVar1,(ulong)in_R8);
    uVar12 = (long)(in_R8->x).n + *puVar1;
    *puVar1 = uVar12 + uVar3;
    psVar20 = r_01;
    secp256k1_scalar_verify(r_01);
    in_RCX = psVar14;
    if (!bVar24 && !CARRY8(uVar12,uVar3)) {
      return extraout_EAX;
    }
  }
  else {
    secp256k1_scalar_cadd_bit_cold_2();
  }
  secp256k1_scalar_cadd_bit_cold_1();
  psStack_70 = r_01;
  if (in_R8->infinity == 0) {
    secp256k1_gej_double_var(&sStack_170,in_R8,(secp256k1_fe *)0x0);
    secp256k1_ge_set_xy(&sStack_d8,&sStack_170.x,&sStack_170.y);
    secp256k1_ge_set_gej_zinv(a_01,in_R8,&sStack_170.z);
    secp256k1_gej_set_ge(&sStack_208,a_01);
    sStack_208.z.n[0] = (in_R8->z).n[0];
    sStack_208.z.n[1] = (in_R8->z).n[1];
    sStack_208.z.n[2] = (in_R8->z).n[2];
    sStack_208.z.n[3] = (in_R8->z).n[3];
    sStack_208.z.n[4] = (in_R8->z).n[4];
    sStack_208.z.magnitude = (in_R8->z).magnitude;
    sStack_208.z.normalized = (in_R8->z).normalized;
    extraout_RDX->n[4] = sStack_170.z.n[4];
    extraout_RDX->magnitude = sStack_170.z.magnitude;
    extraout_RDX->normalized = sStack_170.z.normalized;
    extraout_RDX->n[2] = sStack_170.z.n[2];
    extraout_RDX->n[3] = sStack_170.z.n[3];
    extraout_RDX->n[0] = sStack_170.z.n[0];
    extraout_RDX->n[1] = sStack_170.z.n[1];
    if (1 < (int)psVar20) {
      lVar23 = ((ulong)psVar20 & 0xffffffff) - 1;
      psVar14 = extraout_RDX;
      do {
        a_01 = a_01 + 1;
        psVar14 = psVar14 + 1;
        secp256k1_gej_add_ge_var(&sStack_208,&sStack_208,&sStack_d8,psVar14);
        secp256k1_ge_set_xy(a_01,&sStack_208.x,&sStack_208.y);
        lVar23 = lVar23 + -1;
      } while (lVar23 != 0);
    }
    secp256k1_fe_mul(in_RCX,&sStack_208.z,&sStack_170.z);
    return extraout_EAX_00;
  }
  secp256k1_ecmult_odd_multiples_table_cold_1();
  psVar17 = psVar20;
  psVar19 = a_01;
  psVar14 = extraout_RDX_00;
  uVar11 = extraout_EAX_01;
  psStack_248 = r_01;
  if (psVar20 != (secp256k1_scalar *)0x0) {
    do {
      secp256k1_ge_verify(psVar19);
      secp256k1_fe_verify(psVar14);
      psVar14 = psVar14 + 1;
      psVar17 = (secp256k1_scalar *)((long)psVar17[-1].d + 0x1f);
      psVar19 = psVar19 + 1;
    } while (psVar17 != (secp256k1_scalar *)0x0);
    puVar2 = (undefined1 *)((long)psVar20[-1].d + 0x1f);
    psVar14 = &a_01[(long)puVar2].y;
    secp256k1_fe_verify(psVar14);
    uVar3 = a_01[(long)puVar2].y.n[4];
    uVar15 = (uVar3 >> 0x30) * 0x1000003d1 + psVar14->n[0];
    uVar12 = (uVar15 >> 0x34) + a_01[(long)puVar2].y.n[1];
    uVar21 = (uVar12 >> 0x34) + a_01[(long)puVar2].y.n[2];
    uVar22 = (uVar21 >> 0x34) + a_01[(long)puVar2].y.n[3];
    a_02 = (secp256k1_gej *)(uVar21 & 0xfffffffffffff);
    psVar14->n[0] = uVar15 & 0xfffffffffffff;
    a_01[(long)puVar2].y.n[1] = uVar12 & 0xfffffffffffff;
    a_01[(long)puVar2].y.n[2] = (uint64_t)a_02;
    a_01[(long)puVar2].y.n[3] = uVar22 & 0xfffffffffffff;
    a_01[(long)puVar2].y.n[4] = (uVar22 >> 0x34) + (uVar3 & 0xffffffffffff);
    a_01[(long)puVar2].y.magnitude = 1;
    secp256k1_fe_verify(psVar14);
    sStack_2e0.x.n[0] = extraout_RDX_00[(long)puVar2].n[0];
    sStack_2e0.x.n[1] = extraout_RDX_00[(long)puVar2].n[1];
    sStack_2e0.x.n[2] = extraout_RDX_00[(long)puVar2].n[2];
    sStack_2e0.x.n[3] = (extraout_RDX_00[(long)puVar2].n + 2)[1];
    sStack_2e0.x.n[4] = extraout_RDX_00[(long)puVar2].n[4];
    sStack_2e0.x._40_8_ = (extraout_RDX_00[(long)puVar2].n + 4)[1];
    if (puVar2 != (undefined1 *)0x0) {
      psVar19 = a_01 + (long)((long)psVar20[-1].d + 0x1e);
      psVar14 = extraout_RDX_00 + (long)psVar20;
      puVar18 = (undefined1 *)0x0;
      do {
        psVar14 = psVar14 + -1;
        if (puVar18 != (undefined1 *)0x0) {
          a_02 = &sStack_2e0;
          secp256k1_fe_mul(&sStack_2e0.x,&sStack_2e0.x,psVar14);
        }
        secp256k1_ge_verify(psVar19);
        r_02 = &sStack_2e0;
        secp256k1_fe_verify(&sStack_2e0.x);
        if (psVar19->infinity != 0) {
          secp256k1_ge_table_set_globalz_cold_1();
          secp256k1_gej_verify(a_02);
          if (a_02->infinity == 0) {
            if (a_00 != (secp256k1_fe *)0x0) {
              uVar4 = (a_02->y).n[0];
              uVar5 = (a_02->y).n[1];
              uVar6 = (a_02->y).n[2];
              uVar7 = (a_02->y).n[3];
              iVar8 = (a_02->y).magnitude;
              iVar9 = (a_02->y).normalized;
              a_00->n[4] = (a_02->y).n[4];
              a_00->magnitude = iVar8;
              a_00->normalized = iVar9;
              a_00->n[2] = uVar6;
              a_00->n[3] = uVar7;
              a_00->n[0] = uVar4;
              a_00->n[1] = uVar5;
              secp256k1_fe_verify(a_00);
              uVar3 = a_00->n[4];
              uVar15 = (uVar3 >> 0x30) * 0x1000003d1 + a_00->n[0];
              uVar12 = (uVar15 >> 0x34) + a_00->n[1];
              uVar21 = (uVar12 >> 0x34) + a_00->n[2];
              uVar22 = (uVar21 >> 0x34) + a_00->n[3];
              a_00->n[0] = uVar15 & 0xfffffffffffff;
              a_00->n[1] = uVar12 & 0xfffffffffffff;
              a_00->n[2] = uVar21 & 0xfffffffffffff;
              a_00->n[3] = uVar22 & 0xfffffffffffff;
              a_00->n[4] = (uVar22 >> 0x34) + (uVar3 & 0xffffffffffff);
              a_00->magnitude = 1;
              secp256k1_fe_verify(a_00);
            }
            secp256k1_gej_double(r_02,a_02);
            secp256k1_gej_verify(r_02);
            return extraout_EAX_06;
          }
          secp256k1_gej_set_infinity(r_02);
          if (a_00 != (secp256k1_fe *)0x0) {
            a_00->n[0] = 1;
            a_00->n[1] = 0;
            a_00->n[2] = 0;
            a_00->n[3] = 0;
            a_00->n[4] = 0;
            a_00->magnitude = 1;
            a_00->normalized = 1;
            secp256k1_fe_verify(a_00);
            return extraout_EAX_05;
          }
          return extraout_EAX_04;
        }
        r_00 = (secp256k1_fe *)(sStack_2e0.z.n + 1);
        secp256k1_fe_sqr(r_00,&sStack_2e0.x);
        r = (secp256k1_fe *)(sStack_2e0.y.n + 1);
        secp256k1_fe_mul(r,r_00,&sStack_2e0.x);
        secp256k1_fe_mul(&psVar19->x,&psVar19->x,r_00);
        a_02 = (secp256k1_gej *)&psVar19->y;
        secp256k1_fe_mul((secp256k1_fe *)a_02,(secp256k1_fe *)a_02,r);
        secp256k1_ge_verify(psVar19);
        puVar18 = puVar18 + 1;
        psVar19 = psVar19 + -1;
      } while (puVar2 != puVar18);
      if (psVar20 == (secp256k1_scalar *)0x0) {
        return extraout_EAX_02;
      }
    }
    do {
      secp256k1_ge_verify(a_01);
      a_01 = a_01 + 1;
      psVar20 = (secp256k1_scalar *)((long)psVar20[-1].d + 0x1f);
      uVar11 = extraout_EAX_03;
    } while (psVar20 != (secp256k1_scalar *)0x0);
  }
  return uVar11;
}

Assistant:

SECP256K1_INLINE static uint32_t secp256k1_scalar_get_bits_var(const secp256k1_scalar *a, unsigned int offset, unsigned int count) {
    SECP256K1_SCALAR_VERIFY(a);
    VERIFY_CHECK(count > 0 && count <= 32);
    VERIFY_CHECK(offset + count <= 256);

    if ((offset + count - 1) >> 6 == offset >> 6) {
        return secp256k1_scalar_get_bits_limb32(a, offset, count);
    } else {
        VERIFY_CHECK((offset >> 6) + 1 < 4);
        return ((a->d[offset >> 6] >> (offset & 0x3F)) | (a->d[(offset >> 6) + 1] << (64 - (offset & 0x3F)))) & (0xFFFFFFFF >> (32 - count));
    }
}